

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_9,_0,_1>::evaluate
               (ShaderEvalContext *evalCtx)

{
  MatrixCaseUtils local_84 [12];
  VecAccess<float,_4,_3> local_78;
  Matrix<float,_3,_3> local_60;
  Matrix<float,_3,_3> local_3c;
  
  tcu::Matrix<float,_3,_3>::Matrix(&local_60,(Matrix<float,_3,_3> *)s_constInMat3);
  tcu::operator*(&local_3c,&local_60,-0.2);
  reduceToVec3(local_84,&local_3c);
  local_78.m_vector = &evalCtx->color;
  local_78.m_index[0] = 0;
  local_78.m_index[1] = 1;
  local_78.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_78,(Vector<float,_3> *)local_84);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}